

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

timestamp_t
duckdb::DateTrunc::HourOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
          (timestamp_t input)

{
  dtime_t time_00;
  timestamp_t tVar1;
  date_t date;
  int32_t micros;
  int32_t sec;
  int32_t min;
  int32_t hour;
  dtime_t time;
  date_t local_2c;
  int32_t local_28;
  int32_t local_24;
  int32_t local_20;
  int32_t local_1c;
  dtime_t local_18;
  
  Timestamp::Convert(input,&local_2c,&local_18);
  Time::Convert(local_18,&local_1c,&local_20,&local_24,&local_28);
  time_00 = Time::FromTime(local_1c,0,0,0);
  tVar1 = Timestamp::FromDatetime(local_2c,time_00);
  return (timestamp_t)tVar1.value;
}

Assistant:

static inline TR Operation(TA input) {
			int32_t hour, min, sec, micros;
			date_t date;
			dtime_t time;
			Timestamp::Convert(input, date, time);
			Time::Convert(time, hour, min, sec, micros);
			return Timestamp::FromDatetime(date, Time::FromTime(hour, 0, 0, 0));
		}